

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

Elements *
ftxui::operator|(Elements *__return_storage_ptr__,Elements *elements,Decorator *decorator)

{
  bool bVar1;
  size_type __n;
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> local_98;
  shared_ptr<ftxui::Node> local_78;
  value_type local_68;
  reference local_58;
  shared_ptr<ftxui::Node> *it;
  iterator __end1;
  iterator __begin1;
  Elements *__range1;
  Decorator *decorator_local;
  Elements *elements_local;
  Elements *output;
  
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (__return_storage_ptr__);
  __n = std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
        size(elements);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::reserve
            (__return_storage_ptr__,__n);
  __end1 = std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ::begin(elements);
  it = (shared_ptr<ftxui::Node> *)
       std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
       end(elements);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<ftxui::Node>_*,_std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>_>
                                     *)&it), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<ftxui::Node>_*,_std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>_>
               ::operator*(&__end1);
    std::shared_ptr<ftxui::Node>::shared_ptr(&local_78,local_58);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              (&local_98,decorator);
    operator|((ftxui *)&local_68,&local_78,&local_98);
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    push_back(__return_storage_ptr__,&local_68);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_68);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_98)
    ;
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_78);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<ftxui::Node>_*,_std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Elements operator|(Elements elements, Decorator decorator) {  // NOLINT
  Elements output;
  output.reserve(elements.size());
  for (auto& it : elements) {
    output.push_back(std::move(it) | decorator);
  }
  return output;
}